

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_prop_arrays.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::CopyPropagateArrays::CanUpdateUses
          (CopyPropagateArrays *this,Instruction *original_ptr_inst,uint32_t type_id)

{
  Type *this_00;
  Instruction *def;
  int iVar1;
  IRContext *pIVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  anon_class_32_4_19357304 local_88;
  function<bool_(spvtools::opt::Instruction_*,_unsigned_int)> local_68;
  Type *local_48;
  Type *type;
  DefUseManager *def_use_mgr;
  ConstantManager *const_mgr;
  TypeManager *type_mgr;
  Instruction *pIStack_20;
  uint32_t type_id_local;
  Instruction *original_ptr_inst_local;
  CopyPropagateArrays *this_local;
  
  type_mgr._4_4_ = type_id;
  pIStack_20 = original_ptr_inst;
  original_ptr_inst_local = (Instruction *)this;
  pIVar2 = Pass::context((Pass *)this);
  const_mgr = (ConstantManager *)IRContext::get_type_mgr(pIVar2);
  pIVar2 = Pass::context((Pass *)this);
  def_use_mgr = (DefUseManager *)IRContext::get_constant_mgr(pIVar2);
  pIVar2 = Pass::context((Pass *)this);
  type = (Type *)IRContext::get_def_use_mgr(pIVar2);
  local_48 = analysis::TypeManager::GetType((TypeManager *)const_mgr,type_mgr._4_4_);
  iVar1 = (*local_48->_vptr_Type[0x19])();
  if (CONCAT44(extraout_var,iVar1) == 0) {
    iVar1 = (*local_48->_vptr_Type[0x1b])();
    if (CONCAT44(extraout_var_00,iVar1) == 0) {
      iVar1 = (*local_48->_vptr_Type[0x17])();
      if (CONCAT44(extraout_var_01,iVar1) == 0) {
        iVar1 = (*local_48->_vptr_Type[0x1f])();
        if (CONCAT44(extraout_var_02,iVar1) == 0) {
          this_local._7_1_ = 1;
          goto LAB_0031d8b8;
        }
      }
    }
    def = pIStack_20;
    this_00 = type;
    local_88.type_mgr = (TypeManager *)const_mgr;
    local_88.const_mgr = (ConstantManager *)def_use_mgr;
    local_88.type = local_48;
    local_88.this = this;
    std::function<bool(spvtools::opt::Instruction*,unsigned_int)>::
    function<spvtools::opt::CopyPropagateArrays::CanUpdateUses(spvtools::opt::Instruction*,unsigned_int)::__0,void>
              ((function<bool(spvtools::opt::Instruction*,unsigned_int)> *)&local_68,&local_88);
    this_local._7_1_ = analysis::DefUseManager::WhileEachUse((DefUseManager *)this_00,def,&local_68)
    ;
    std::function<bool_(spvtools::opt::Instruction_*,_unsigned_int)>::~function(&local_68);
  }
  else {
    this_local._7_1_ = 0;
  }
LAB_0031d8b8:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool CopyPropagateArrays::CanUpdateUses(Instruction* original_ptr_inst,
                                        uint32_t type_id) {
  analysis::TypeManager* type_mgr = context()->get_type_mgr();
  analysis::ConstantManager* const_mgr = context()->get_constant_mgr();
  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();

  analysis::Type* type = type_mgr->GetType(type_id);
  if (type->AsRuntimeArray()) {
    return false;
  }

  if (!type->AsStruct() && !type->AsArray() && !type->AsPointer()) {
    // If the type is not an aggregate, then the desired type must be the
    // same as the current type.  No work to do, and we can do that.
    return true;
  }

  return def_use_mgr->WhileEachUse(original_ptr_inst, [this, type_mgr,
                                                       const_mgr,
                                                       type](Instruction* use,
                                                             uint32_t) {
    if (IsDebugDeclareOrValue(use)) return true;

    switch (use->opcode()) {
      case spv::Op::OpLoad: {
        analysis::Pointer* pointer_type = type->AsPointer();
        uint32_t new_type_id = type_mgr->GetId(pointer_type->pointee_type());

        if (new_type_id != use->type_id()) {
          return CanUpdateUses(use, new_type_id);
        }
        return true;
      }
      case spv::Op::OpAccessChain: {
        analysis::Pointer* pointer_type = type->AsPointer();
        const analysis::Type* pointee_type = pointer_type->pointee_type();

        std::vector<uint32_t> access_chain;
        for (uint32_t i = 1; i < use->NumInOperands(); ++i) {
          const analysis::Constant* index_const =
              const_mgr->FindDeclaredConstant(use->GetSingleWordInOperand(i));
          if (index_const) {
            access_chain.push_back(index_const->GetU32());
          } else {
            // Variable index means the type is a type where every element
            // is the same type.  Use element 0 to get the type.
            access_chain.push_back(0);

            // We are trying to access a struct with variable indices.
            // This cannot happen.
            if (pointee_type->kind() == analysis::Type::kStruct) {
              return false;
            }
          }
        }

        const analysis::Type* new_pointee_type =
            type_mgr->GetMemberType(pointee_type, access_chain);
        analysis::Pointer pointerTy(new_pointee_type,
                                    pointer_type->storage_class());
        uint32_t new_pointer_type_id =
            context()->get_type_mgr()->GetTypeInstruction(&pointerTy);
        if (new_pointer_type_id == 0) {
          return false;
        }

        if (new_pointer_type_id != use->type_id()) {
          return CanUpdateUses(use, new_pointer_type_id);
        }
        return true;
      }
      case spv::Op::OpCompositeExtract: {
        std::vector<uint32_t> access_chain;
        for (uint32_t i = 1; i < use->NumInOperands(); ++i) {
          access_chain.push_back(use->GetSingleWordInOperand(i));
        }

        const analysis::Type* new_type =
            type_mgr->GetMemberType(type, access_chain);
        uint32_t new_type_id = type_mgr->GetTypeInstruction(new_type);
        if (new_type_id == 0) {
          return false;
        }

        if (new_type_id != use->type_id()) {
          return CanUpdateUses(use, new_type_id);
        }
        return true;
      }
      case spv::Op::OpStore:
        // If needed, we can create an element-by-element copy to change the
        // type of the value being stored.  This way we can always handled
        // stores.
        return true;
      case spv::Op::OpImageTexelPointer:
      case spv::Op::OpName:
        return true;
      default:
        return use->IsDecoration();
    }
  });
}